

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

uint64 google::protobuf::internal::ReadVarint64(char **p)

{
  char *pcVar1;
  uint64 local_20;
  uint64 tmp;
  
  pcVar1 = VarintParse<unsigned_long>(*p,&local_20);
  *p = pcVar1;
  return local_20;
}

Assistant:

inline uint64 ReadVarint64(const char** p) {
  uint64 tmp;
  *p = VarintParse(*p, &tmp);
  return tmp;
}